

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

Buffer * __thiscall Liby::Connection::sync_read(Buffer *__return_storage_ptr__,Connection *this)

{
  element_type *peVar1;
  char *pcVar2;
  void *__buf;
  ssize_t sVar3;
  size_t in_RCX;
  anon_class_8_1_8991fb9c aStack_78;
  int nbytes;
  function<void_()> local_70;
  undefined1 local_50 [8];
  DeferCaller defer;
  Connection *this_local;
  Buffer *ret;
  
  Buffer::Buffer(__return_storage_ptr__,0x1000);
  peVar1 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->socket_);
  Socket::setNoblock(peVar1,false);
  aStack_78.this = this;
  std::function<void()>::function<Liby::Connection::sync_read()::__0,void>
            ((function<void()> *)&local_70,&stack0xffffffffffffff88);
  DeferCaller::DeferCaller((DeferCaller *)local_50,&local_70);
  std::function<void_()>::~function(&local_70);
  peVar1 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->socket_);
  pcVar2 = Buffer::data(__return_storage_ptr__);
  __buf = (void *)Buffer::capacity(__return_storage_ptr__);
  sVar3 = Socket::read(peVar1,(int)pcVar2,__buf,in_RCX);
  if (0 < (int)sVar3) {
    Buffer::append(__return_storage_ptr__,(long)(int)sVar3);
  }
  DeferCaller::~DeferCaller((DeferCaller *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Buffer Connection::sync_read() {
    Buffer ret(4096);
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    int nbytes = socket_->read(static_cast<void *>(ret.data()), ret.capacity());
    if (nbytes > 0) {
        ret.append(nbytes);
    }
    return ret;
}